

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_A.cpp
# Opt level: O0

void __thiscall A::do_comp(A *this)

{
  int iVar1;
  int k;
  int j;
  int i;
  A *this_local;
  
  for (i = 0; i < this->n_; i = i + 1) {
    for (j = 0; j < this->n_; j = j + 1) {
      for (k = 0; k < this->n_; k = k + 1) {
        iVar1 = i * this->n_ + j;
        this->c[iVar1] = this->a[i * this->n_ + k] * this->b[k * this->n_ + j] + this->c[iVar1];
      }
    }
  }
  return;
}

Assistant:

void A::do_comp() {
  for(int i = 0; i < n_; i++)
    for(int j = 0; j < n_; j++)
      for(int k = 0; k < n_; k++)
        c[i*n_+j] += a[i*n_+k] * b[k*n_+j];
}